

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

Curve * __thiscall ON_ShutLining::AddCurve(ON_ShutLining *this)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  ON_XMLNode *this_00;
  undefined4 extraout_var;
  Curve *this_01;
  Curve *curve;
  
  pOVar2 = ON_InternalXMLImpl::Node
                     (&((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl);
  this_00 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(this_00,L"curve");
  iVar1 = (*pOVar2->_vptr_ON_XMLNode[0xb])(pOVar2,this_00);
  this_01 = (Curve *)operator_new(8);
  Curve::Curve(this_01,(ON_XMLNode *)CONCAT44(extraout_var,iVar1));
  curve = this_01;
  ON_SimpleArray<ON_ShutLining::Curve_*>::Append(&this->m_impl_sl->m_curves,&curve);
  return curve;
}

Assistant:

ON_ShutLining::Curve& ON_ShutLining::AddCurve(void)
{
  ON_XMLNode* curve_node = m_impl->Node().AttachChildNode(new ON_XMLNode(ON_SHUTLINING_CURVE));
  Curve* curve = new Curve(*curve_node);
  m_impl_sl->m_curves.Append(curve);

  return *curve;
}